

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  float *pfVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  long lVar15;
  
  iVar1 = a->c;
  if (0 < (long)iVar1) {
    uVar8 = a->h * a->w * a->d * a->elempack;
    lVar12 = 0;
    do {
      pfVar13 = (float *)(a->cstep * lVar12 * a->elemsize + (long)a->data);
      pfVar14 = (float *)(b->cstep * lVar12 * b->elemsize + (long)b->data);
      pfVar9 = (float *)(c->cstep * lVar12 * c->elemsize + (long)c->data);
      if ((int)uVar8 < 4) {
        uVar11 = 0;
      }
      else {
        iVar10 = 3;
        do {
          fVar2 = pfVar13[1];
          fVar3 = pfVar13[2];
          fVar4 = pfVar13[3];
          fVar5 = pfVar14[1];
          fVar6 = pfVar14[2];
          fVar7 = pfVar14[3];
          *pfVar9 = *pfVar13 - *pfVar14;
          pfVar9[1] = fVar2 - fVar5;
          pfVar9[2] = fVar3 - fVar6;
          pfVar9[3] = fVar4 - fVar7;
          pfVar13 = pfVar13 + 4;
          pfVar14 = pfVar14 + 4;
          pfVar9 = pfVar9 + 4;
          iVar10 = iVar10 + 4;
          uVar11 = uVar8 & 0xfffffffc;
        } while (iVar10 < (int)uVar8);
      }
      if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
        lVar15 = 0;
        do {
          pfVar9[lVar15] = pfVar13[lVar15] - pfVar14[lVar15];
          lVar15 = lVar15 + 1;
        } while (uVar8 - uVar11 != (int)lVar15);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar1);
  }
  return iVar1;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}